

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL LOADInitializeModules(void)

{
  BOOL local_c;
  
  if (exe_module.prev != (_MODSTRUCT *)0x0) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x34d,"exe_module.prev == nullptr","");
    fflush(_stderr);
    abort();
  }
  InternalInitializeCriticalSection(&module_critsec);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  exe_module.self = &exe_module;
  exe_module.dl_handle = (void *)dlopen(0,1);
  if (exe_module.dl_handle == (void *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dlerror();
    local_c = 0;
  }
  else {
    exe_module.lib_name = (LPWSTR)0x0;
    exe_module.refcount = -1;
    exe_module.next = &exe_module;
    exe_module.prev = &exe_module;
    exe_module.pDllMain = (PDLLMAIN)0x0;
    exe_module.hinstance = (HINSTANCE)0x0;
    exe_module.threadLibCalls = 1;
    local_c = 1;
  }
  return local_c;
}

Assistant:

BOOL LOADInitializeModules()
{
    _ASSERTE(exe_module.prev == nullptr);

    InternalInitializeCriticalSection(&module_critsec);

    // Initialize module for main executable
    TRACE("Initializing module for main executable\n");

    exe_module.self = (HMODULE)&exe_module;
    exe_module.dl_handle = dlopen(nullptr, RTLD_LAZY);
    if (exe_module.dl_handle == nullptr)
    {
        ERROR("Executable module will be broken : dlopen(nullptr) failed dlerror message is \"%s\" \n", dlerror());
        return FALSE;
    }
    exe_module.lib_name = nullptr;
    exe_module.refcount = -1;
    exe_module.next = &exe_module;
    exe_module.prev = &exe_module;
    exe_module.pDllMain = nullptr;
    exe_module.hinstance = nullptr;
    exe_module.threadLibCalls = TRUE;
    return TRUE;
}